

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

bool __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::reserve
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,size_t length)

{
  size_t sVar1;
  C *pCVar2;
  
  sVar1 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length;
  pCVar2 = createBuffer(this,length,true);
  if (pCVar2 != (C *)0x0) {
    (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length = sVar1;
    (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p[sVar1] = 0;
  }
  return pCVar2 != (C *)0x0;
}

Assistant:

bool
	reserve(size_t length) {
		size_t oldLength = this->m_length;
		if (!createBuffer(length, true))
			return false;

		ASSERT(this->m_isNullTerminated);
		this->m_length = oldLength; // restore original length
		this->m_p[oldLength] = 0;
		return true;
	}